

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median-sorted.cpp
# Opt level: O0

double findMedianSortedArrays
                 (vector<int,_std::allocator<int>_> *A,vector<int,_std::allocator<int>_> *B)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  ostream *poVar6;
  int local_38;
  int local_34;
  int c;
  int b;
  int a;
  int medPos;
  int lB;
  int lA;
  vector<int,_std::allocator<int>_> *B_local;
  vector<int,_std::allocator<int>_> *A_local;
  
  sVar4 = std::vector<int,_std::allocator<int>_>::size(A);
  iVar2 = (int)sVar4;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(B);
  iVar3 = (int)sVar4;
  c = 0;
  local_34 = 0;
  for (local_38 = 0; local_38 < iVar2 + iVar3 / 2 + -1; local_38 = local_38 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](A,(long)c);
    iVar1 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](B,(long)local_34);
    if (iVar1 < *pvVar5) {
      if (c < iVar2 + -1) {
        c = c + 1;
      }
      else {
        local_34 = local_34 + 1;
      }
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](A,(long)c);
    iVar1 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](B,(long)local_34);
    if (*pvVar5 <= iVar1) {
      if (local_34 < iVar3 + -1) {
        local_34 = local_34 + 1;
      }
      else {
        c = c + 1;
      }
    }
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](A,(long)(c + -1));
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
  poVar6 = std::operator<<(poVar6,' ');
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](B,(long)(local_34 + -1));
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  if ((iVar2 + iVar3) % 2 == 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](A,(long)(c + -1));
    iVar2 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](B,(long)(local_34 + -1));
    if (iVar2 < *pvVar5) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](A,(long)(c + -1));
      A_local = (vector<int,_std::allocator<int>_> *)(double)*pvVar5;
    }
    else {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](B,(long)(local_34 + -1));
      A_local = (vector<int,_std::allocator<int>_> *)(double)*pvVar5;
    }
  }
  else {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](A,(long)(c + -1));
    iVar2 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](B,(long)(local_34 + -1));
    A_local = (vector<int,_std::allocator<int>_> *)(((double)iVar2 + (double)*pvVar5) / 2.0);
  }
  return (double)A_local;
}

Assistant:

double findMedianSortedArrays(const vector<int> &A, const vector<int> &B) {

  int lA = A.size();
  int lB = B.size();
  int medPos = (lA + lB / 2) - 1;
  int a = 0, b = 0 , c = 0;
  while (c < medPos) {
    if (A[a] < B[b]) {
      if (a < lA - 1) a++;
      else b++;
    }
    if (A[a] >= B[b]) {
      if (b < lB - 1) b++;
      else a++;
    }
    c++;
  }
  cout<<A[a-1]<<' '<<B[b-1]<<endl;

  if ((lA + lB) % 2 == 1) {
    if (A[a-1] < B[b-1]) return A[a-1];
    else return B[b-1];
  } else {
    return (((double)A[a-1]) + ((double)B[b-1])) / 2;
  }
}